

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

void saveCPP(pixels *p,string *cppfilename,bool tiled,int xs,int ys,exr_compression_t comp,int fw,
            int fh,int dwx,int dwy)

{
  Channel *pCVar1;
  Slice *pSVar2;
  int iVar3;
  undefined4 *puVar4;
  char *pcVar5;
  Vec2 *pVVar6;
  int in_ECX;
  byte in_DL;
  long in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  undefined4 extraout_XMM0_Db;
  double dVar7;
  double dVar8;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  OutputFile out_1;
  TiledOutputFile out;
  TileDescription td;
  int c_1;
  V2i origin;
  FrameBuffer fb;
  int c;
  Header hdr;
  char *in_stack_fffffffffffffcc8;
  Vec2<int> *in_stack_fffffffffffffcd0;
  uint line;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  undefined1 local_240 [16];
  undefined1 local_230 [36];
  uint local_20c;
  undefined1 local_200 [60];
  int local_1c4;
  undefined1 local_1c0 [56];
  undefined1 local_188 [56];
  undefined1 local_150 [56];
  Vec2<int> local_118;
  char local_110 [48];
  Channel local_e0 [16];
  Channel local_d0 [16];
  int local_c0;
  Channel local_bc [28];
  Vec2<float> local_a0;
  Vec2<int> local_98;
  Vec2<int> local_90;
  Box local_88 [16];
  Vec2<int> local_78;
  Vec2<int> local_70;
  Box local_68 [16];
  TileDescription local_58 [3];
  undefined4 local_20;
  int local_1c;
  int local_18;
  byte local_11;
  long local_8;
  
  local_11 = in_DL & 1;
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_8 = in_RDI;
  Imath_3_2::Vec2<int>::Vec2(&local_70,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_78,in_stack_00000008 + -1,in_stack_00000010 + -1);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             in_stack_fffffffffffffcd0);
  Imath_3_2::Vec2<int>::Vec2(&local_90,in_stack_00000018,in_stack_00000020);
  Imath_3_2::Vec2<int>::Vec2
            (&local_98,in_stack_00000018 + -1 + in_stack_00000008,
             in_stack_00000020 + -1 + in_stack_00000010);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             in_stack_fffffffffffffcd0);
  line = (uint)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  Imath_3_2::Vec2<float>::Vec2(&local_a0,0.0,0.0);
  Imf_3_4::Header::Header
            ((Header *)local_58,local_68,local_88,1.0,(Vec2 *)&local_a0,1.0,INCREASING_Y,
             ZIP_COMPRESSION);
  puVar4 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar4 = local_20;
  puVar4 = (undefined4 *)Imf_3_4::Header::zipCompressionLevel();
  *puVar4 = 4;
  iVar3 = Imf_3_4::Header::zipCompressionLevel();
  if (iVar3 != 4) {
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),line,
                   in_stack_fffffffffffffcc8);
  }
  pcVar5 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_bc,UINT,local_18,local_1c,false);
  Imf_3_4::ChannelList::insert(pcVar5,(Channel *)0x36bf4b);
  for (local_c0 = 0; local_c0 < 5; local_c0 = local_c0 + 1) {
    pcVar5 = (char *)Imf_3_4::Header::channels();
    pCVar1 = (Channel *)channels[local_c0];
    Imf_3_4::Channel::Channel(local_d0,HALF,local_18,local_1c,false);
    Imf_3_4::ChannelList::insert(pcVar5,pCVar1);
  }
  pcVar5 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_e0,FLOAT,local_18,local_1c,false);
  Imf_3_4::ChannelList::insert(pcVar5,(Channel *)0x36bfa5);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x116ff0);
  Imath_3_2::Vec2<int>::Vec2(&local_118,in_stack_00000018,in_stack_00000020);
  pVVar6 = (Vec2 *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x117021);
  Imf_3_4::Slice::Make
            ((PixelType)local_150,(void *)0x0,pVVar6,(long)&local_118,(long)in_stack_00000008,
             (long)in_stack_00000010,0,*(int *)(local_8 + 8) << 2,local_18,0.0,SUB41(local_1c,0),
             false);
  Imf_3_4::FrameBuffer::insert(local_110,(Slice *)0x36bf4b);
  pVVar6 = (Vec2 *)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1170bf);
  Imf_3_4::Slice::Make
            ((PixelType)local_188,(void *)0x1,pVVar6,(long)&local_118,(long)in_stack_00000008,
             (long)in_stack_00000010,0,*(int *)(local_8 + 8) * 2,local_18,0.0,SUB41(local_1c,0),
             false);
  Imf_3_4::FrameBuffer::insert(local_110,(Slice *)0x1a2c01);
  pVVar6 = (Vec2 *)std::vector<float,_std::allocator<float>_>::data
                             ((vector<float,_std::allocator<float>_> *)0x117160);
  Imf_3_4::Slice::Make
            ((PixelType)local_1c0,(void *)0x2,pVVar6,(long)&local_118,(long)in_stack_00000008,
             (long)in_stack_00000010,0,*(int *)(local_8 + 8) << 2,local_18,0.0,SUB41(local_1c,0),
             false);
  Imf_3_4::FrameBuffer::insert(local_110,(Slice *)0x36bfa5);
  for (local_1c4 = 0; local_1c4 < 4; local_1c4 = local_1c4 + 1) {
    pSVar2 = (Slice *)channels[local_1c4];
    pVVar6 = (Vec2 *)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x117238)
    ;
    Imf_3_4::Slice::Make
              ((PixelType)local_200,(void *)0x1,pVVar6,(long)&local_118,(long)in_stack_00000008,
               (long)in_stack_00000010,0,*(int *)(local_8 + 8) * 2,local_18,0.0,SUB41(local_1c,0),
               false);
    Imf_3_4::FrameBuffer::insert(local_110,pSVar2);
  }
  if ((local_11 & 1) == 0) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar3 = Imf_3_4::globalThreadCount();
    Imf_3_4::OutputFile::OutputFile((OutputFile *)local_240,pcVar5,(Header *)local_58,iVar3);
    Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)local_240);
    Imf_3_4::OutputFile::writePixels((int)local_240);
    Imf_3_4::OutputFile::~OutputFile((OutputFile *)local_240);
  }
  else {
    Imf_3_4::TileDescription::TileDescription
              ((TileDescription *)(local_230 + 0x20),0x20,0x20,ONE_LEVEL,ROUND_DOWN);
    Imf_3_4::Header::setTileDescription(local_58);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar3 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledOutputFile::TiledOutputFile
              ((TiledOutputFile *)local_230,pcVar5,(Header *)local_58,iVar3);
    Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)local_230);
    dVar7 = std::ceil((double)CONCAT44(extraout_XMM0_Db,
                                       (float)in_stack_00000008 / (float)(uint)local_230._32_4_));
    dVar8 = std::ceil((double)(ulong)(uint)((float)in_stack_00000010 / (float)local_20c));
    Imf_3_4::TiledOutputFile::writeTiles
              ((int)local_230,0,(int)(SUB84(dVar7,0) + -1.0),0,(int)(SUB84(dVar8,0) + -1.0));
    Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)local_230);
  }
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x117506);
  Imf_3_4::Header::~Header((Header *)local_58);
  return;
}

Assistant:

static void
saveCPP (
    pixels&            p,
    const std::string& cppfilename,
    bool               tiled,
    int                xs,
    int                ys,
    exr_compression_t  comp,
    int                fw,
    int                fh,
    int                dwx,
    int                dwy)
{
    Header hdr (
        (Box2i (V2i (0, 0), V2i (fw - 1, fh - 1))),
        (Box2i (V2i (dwx, dwy), V2i (dwx + fw - 1, dwy + fh - 1))));

    hdr.compression ()         = (IMF::Compression) ((int) comp);
    hdr.zipCompressionLevel () = 4;
    EXRCORE_TEST (((const Header&) hdr).zipCompressionLevel () == 4);

    hdr.channels ().insert ("I", Channel (IMF::UINT, xs, ys));
    for (int c = 0; c < 5; ++c)
        hdr.channels ().insert (channels[c], Channel (IMF::HALF, xs, ys));
    hdr.channels ().insert ("F", Channel (IMF::FLOAT, xs, ys));
    {
        FrameBuffer fb;
        V2i         origin{dwx, dwy};
        fb.insert (
            "I",
            Slice::Make (
                IMF::UINT,
                p.i.data (),
                origin,
                fw,
                fh,
                0,
                4 * p._stride_x,
                xs,
                ys,
                0.0,
                false,
                false));
        fb.insert (
            "H",
            Slice::Make (
                IMF::HALF,
                p.h.data (),
                origin,
                fw,
                fh,
                0,
                2 * p._stride_x,
                xs,
                ys,
                0.0,
                false,
                false));
        fb.insert (
            "F",
            Slice::Make (
                IMF::FLOAT,
                p.f.data (),
                origin,
                fw,
                fh,
                0,
                4 * p._stride_x,
                xs,
                ys,
                0.0,
                false,
                false));

        for (int c = 0; c < 4; c++)
        {
            fb.insert (
                channels[c],
                Slice::Make (
                    IMF::HALF,
                    p.rgba[c].data (),
                    origin,
                    fw,
                    fh,
                    0,
                    2 * p._stride_x,
                    xs,
                    ys,
                    0.0,
                    false,
                    false));
        }

        if (tiled)
        {
            TileDescription td;
            hdr.setTileDescription (td);
            TiledOutputFile out (cppfilename.c_str (), hdr);
            out.setFrameBuffer (fb);
            out.writeTiles (
                0,
                static_cast<int> (
                    ceil (
                        static_cast<float> (fw) /
                        static_cast<float> (td.xSize)) -
                    1),
                0,
                static_cast<int> (
                    ceil (
                        static_cast<float> (fh) /
                        static_cast<float> (td.ySize)) -
                    1));
        }
        else
        {
            OutputFile out (cppfilename.c_str (), hdr);
            out.setFrameBuffer (fb);
            out.writePixels (fh);
        }
    }
}